

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

Error __thiscall asmjit::JitRuntime::_add(JitRuntime *this,void **dst,CodeHolder *code)

{
  VMemMgr *this_00;
  Error EVar1;
  size_t size;
  void *_dst;
  size_t used;
  
  size = CodeHolder::getCodeSize(code);
  if (size == 0) {
    *dst = (void *)0x0;
    EVar1 = 10;
  }
  else {
    this_00 = &this->_memMgr;
    _dst = VMemMgr::alloc(this_00,size,(uint)(this->super_HostRuntime).super_Runtime._allocType);
    if (_dst == (void *)0x0) {
      *dst = (void *)0x0;
      EVar1 = 2;
    }
    else {
      used = CodeHolder::relocate(code,_dst,0xffffffffffffffff);
      if (used == 0) {
        *dst = (void *)0x0;
        VMemMgr::release(this_00,_dst);
        EVar1 = 4;
      }
      else {
        if (used < size) {
          VMemMgr::shrink(this_00,_dst,used);
        }
        (*(this->super_HostRuntime).super_Runtime._vptr_Runtime[4])(this,_dst,used);
        *dst = _dst;
        EVar1 = 0;
      }
    }
  }
  return EVar1;
}

Assistant:

Error JitRuntime::_add(void** dst, CodeHolder* code) noexcept {
  size_t codeSize = code->getCodeSize();
  if (ASMJIT_UNLIKELY(codeSize == 0)) {
    *dst = nullptr;
    return DebugUtils::errored(kErrorNoCodeGenerated);
  }

  void* p = _memMgr.alloc(codeSize, getAllocType());
  if (ASMJIT_UNLIKELY(!p)) {
    *dst = nullptr;
    return DebugUtils::errored(kErrorNoVirtualMemory);
  }

  // Relocate the code and release the unused memory back to `VMemMgr`.
  size_t relocSize = code->relocate(p);
  if (ASMJIT_UNLIKELY(relocSize == 0)) {
    *dst = nullptr;
    _memMgr.release(p);
    return DebugUtils::errored(kErrorInvalidState);
  }

  if (relocSize < codeSize)
    _memMgr.shrink(p, relocSize);

  flush(p, relocSize);
  *dst = p;

  return kErrorOk;
}